

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O2

CoverageType
tcu::calculateTriangleCoverage
          (Vec4 *p0,Vec4 *p1,Vec4 *p2,IVec2 *pixel,IVec2 *viewportSize,int subpixelBits,
          bool multisample)

{
  I64Vec2 *pIVar1;
  I64Vec2 *pIVar2;
  I64Vec2 *pIVar3;
  ulong uVar4;
  long lVar5;
  Vector<long,_2> *pVVar6;
  ulong uVar7;
  byte bVar8;
  byte bVar9;
  long lVar10;
  ulong uVar11;
  long lVar12;
  Vec4 *pVVar13;
  long lVar14;
  ulong uVar15;
  CoverageType CVar16;
  Vector<long,_2> *a;
  bool bVar17;
  ulong uVar18;
  Vector<long,_2> *a_00;
  uint uVar19;
  uint uVar20;
  int iVar22;
  undefined1 auVar21 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  float fVar25;
  int iVar26;
  undefined1 auVar27 [16];
  float fVar28;
  float fVar29;
  deInt64 maxPixelDistanceSquared;
  I64Vec2 line;
  I64Vec2 v0;
  Vec2 triangleScreenSpace [3];
  Vector<long,_2> *local_1d0;
  I64Vec2 v1;
  I64Vec2 endPos;
  I64Vec2 edge;
  I64Vec2 v;
  I64Vec2 startPos;
  I64Vec2 pixelCenterPosition;
  Vector<float,_2> local_a8;
  undefined1 local_a0 [16];
  Vector<float,_2> local_90;
  Vector<float,_2> local_88;
  Vector<float,_2> local_80;
  I64Vec2 pixelCorners [4];
  
  bVar8 = (byte)subpixelBits;
  uVar15 = 1L << (bVar8 & 0x3f);
  uVar4 = 4;
  if (multisample) {
    uVar4 = uVar15;
  }
  fVar29 = p1->m_data[0];
  fVar28 = p0->m_data[3];
  fVar25 = p2->m_data[0];
  auVar23._8_8_ = 0;
  auVar23._0_8_ = *(ulong *)p0->m_data;
  auVar27._4_4_ = fVar28;
  auVar27._0_4_ = fVar28;
  auVar27._8_4_ = fVar28;
  auVar27._12_4_ = fVar28;
  auVar23 = divps(auVar23,auVar27);
  local_a8.m_data = auVar23._0_8_;
  fVar28 = (p2->m_data[1] / p2->m_data[3] - auVar23._4_4_) *
           (fVar29 / p1->m_data[3] - auVar23._0_4_) -
           (fVar25 / p2->m_data[3] - auVar23._0_4_) *
           (p1->m_data[1] / p1->m_data[3] - auVar23._4_4_);
  uVar19 = -(uint)(0.0 < fVar28);
  auVar24._0_4_ = ~uVar19 & (uint)fVar25 | uVar19 & (uint)fVar29;
  pVVar13 = p2;
  if (fVar28 <= 0.0) {
    pVVar13 = p1;
    p1 = p2;
    fVar25 = fVar29;
  }
  auVar24._12_4_ = pVVar13->m_data[1];
  auVar24._8_4_ = fVar25;
  auVar21._4_4_ = p1->m_data[3];
  auVar21._0_4_ = p1->m_data[3];
  auVar21._8_4_ = pVVar13->m_data[3];
  auVar21._12_4_ = pVVar13->m_data[3];
  auVar24._4_4_ = p1->m_data[1];
  local_a0 = divps(auVar24,auVar21);
  edge.m_data[0] = 0x3f8000003f800000;
  operator+(&local_a8,(Vector<float,_2> *)&edge);
  operator*(0.5,(Vector<float,_2> *)&pixelCenterPosition);
  v.m_data[0] = CONCAT44((float)(int)((ulong)*(undefined8 *)viewportSize->m_data >> 0x20),
                         (float)(int)*(undefined8 *)viewportSize->m_data);
  operator*((Vector<float,_2> *)pixelCorners,(Vector<float,_2> *)&v);
  v1.m_data[0] = 0x3f8000003f800000;
  operator+((Vector<float,_2> *)local_a0,(Vector<float,_2> *)&v1);
  operator*(0.5,(Vector<float,_2> *)&v0);
  startPos.m_data[0] =
       CONCAT44((float)(int)((ulong)*(undefined8 *)viewportSize->m_data >> 0x20),
                (float)(int)*(undefined8 *)viewportSize->m_data);
  operator*((Vector<float,_2> *)&line,(Vector<float,_2> *)&startPos);
  local_88.m_data[0] = 1.0;
  local_88.m_data[1] = 1.0;
  operator+((Vector<float,_2> *)(local_a0 + 8),&local_88);
  operator*(0.5,&local_80);
  local_90.m_data[0] = (float)(int)*(undefined8 *)viewportSize->m_data;
  local_90.m_data[1] = (float)(int)((ulong)*(undefined8 *)viewportSize->m_data >> 0x20);
  operator*((Vector<float,_2> *)&endPos,&local_90);
  fVar29 = (float)(~-(uint)(triangleScreenSpace[1].m_data[0] <= triangleScreenSpace[0].m_data[0]) &
                   (uint)triangleScreenSpace[1].m_data[0] |
                  -(uint)(triangleScreenSpace[1].m_data[0] <= triangleScreenSpace[0].m_data[0]) &
                  (uint)triangleScreenSpace[0].m_data[0]);
  uVar19 = -(uint)(triangleScreenSpace[2].m_data[0] <= fVar29);
  edge.m_data[0] = (long)pixel->m_data[0];
  fVar25 = (float)pixel->m_data[0];
  CVar16 = COVERAGE_NONE;
  if (fVar25 <= (float)(~uVar19 & (uint)triangleScreenSpace[2].m_data[0] | uVar19 & (uint)fVar29) +
                1.0) {
    fVar29 = (float)(~-(uint)(triangleScreenSpace[0].m_data[1] <= triangleScreenSpace[1].m_data[1])
                     & (uint)triangleScreenSpace[1].m_data[1] |
                    -(uint)(triangleScreenSpace[0].m_data[1] <= triangleScreenSpace[1].m_data[1]) &
                    (uint)triangleScreenSpace[0].m_data[1]);
    uVar19 = -(uint)(fVar29 <= triangleScreenSpace[2].m_data[1]);
    edge.m_data[1] = (long)pixel->m_data[1];
    fVar28 = (float)pixel->m_data[1];
    if ((((float)(~uVar19 & (uint)triangleScreenSpace[2].m_data[1] | uVar19 & (uint)fVar29) + -1.0
          <= fVar28) &&
        (fVar29 = (float)(~-(uint)(triangleScreenSpace[0].m_data[0] <=
                                  triangleScreenSpace[1].m_data[0]) &
                          (uint)triangleScreenSpace[1].m_data[0] |
                         (uint)triangleScreenSpace[0].m_data[0] &
                         -(uint)(triangleScreenSpace[0].m_data[0] <=
                                triangleScreenSpace[1].m_data[0])),
        uVar19 = -(uint)(fVar29 <= triangleScreenSpace[2].m_data[0]),
        (float)(~uVar19 & (uint)triangleScreenSpace[2].m_data[0] | uVar19 & (uint)fVar29) + -1.0 <=
        fVar25)) &&
       (fVar29 = (float)(~-(uint)(triangleScreenSpace[1].m_data[1] <=
                                 triangleScreenSpace[0].m_data[1]) &
                         (uint)triangleScreenSpace[1].m_data[1] |
                        (uint)triangleScreenSpace[0].m_data[1] &
                        -(uint)(triangleScreenSpace[1].m_data[1] <= triangleScreenSpace[0].m_data[1]
                               )), uVar19 = -(uint)(triangleScreenSpace[2].m_data[1] <= fVar29),
       fVar28 <= (float)(~uVar19 & (uint)triangleScreenSpace[2].m_data[1] | uVar19 & (uint)fVar29) +
                 1.0)) {
      pVVar6 = pixelCorners;
      v.m_data[0] = uVar15;
      v.m_data[1] = uVar15;
      operator*(&edge,&v);
      uVar18 = uVar15 >> 1;
      line.m_data[0] = uVar18;
      line.m_data[1] = uVar18;
      operator+(pVVar6,&line);
      fVar29 = (float)uVar15;
      uVar19 = -(uint)(triangleScreenSpace[0].m_data[0] * fVar29 < 0.0);
      iVar26 = (int)((float)(~uVar19 & 0x3f000000 | uVar19 & 0xbf000000) +
                    triangleScreenSpace[0].m_data[0] * fVar29);
      pixelCorners[0].m_data[0] = CONCAT44(-(uint)(iVar26 < 0),iVar26);
      uVar19 = -(uint)(triangleScreenSpace[1].m_data[0] * fVar29 < 0.0);
      iVar26 = (int)((float)(~uVar19 & 0x3f000000 | uVar19 & 0xbf000000) +
                    triangleScreenSpace[1].m_data[0] * fVar29);
      pixelCorners[1].m_data[0] = CONCAT44(-(uint)(iVar26 < 0),iVar26);
      uVar19 = -(uint)(triangleScreenSpace[2].m_data[0] * fVar29 < 0.0);
      uVar20 = -(uint)(triangleScreenSpace[2].m_data[1] * fVar29 < 0.0);
      iVar26 = (int)((float)(~uVar19 & 0x3f000000 | uVar19 & 0xbf000000) +
                    triangleScreenSpace[2].m_data[0] * fVar29);
      iVar22 = (int)((float)(~uVar20 & 0x3f000000 | uVar20 & 0xbf000000) +
                    triangleScreenSpace[2].m_data[1] * fVar29);
      bVar9 = 2;
      if (multisample) {
        bVar9 = bVar8;
      }
      pixelCorners[2].m_data[0] = CONCAT44(-(uint)(iVar26 < 0),iVar26);
      pixelCorners[3].m_data[0] = CONCAT44(-(uint)(iVar22 < 0),iVar22);
      bVar17 = true;
      lVar12 = -3;
      local_1d0 = &edge;
      while (lVar12 != 0) {
        lVar5 = lVar12 + 4;
        lVar12 = lVar12 + 1;
        if (lVar12 == 0) {
          lVar5 = 0;
        }
        operator-(pixelCorners + lVar5,pVVar6);
        operator-(&pixelCenterPosition,pVVar6);
        lVar14 = v.m_data[1] * edge.m_data[0] - v.m_data[0] * edge.m_data[1];
        lVar10 = lVar14 * lVar14;
        lVar5 = (edge.m_data[0] * edge.m_data[0] + edge.m_data[1] * edge.m_data[1]) *
                (uVar4 << (bVar9 & 0x3f));
        if (lVar14 < 0) {
          if (lVar10 - lVar5 != 0 && lVar5 <= lVar10) {
            return COVERAGE_NONE;
          }
LAB_0058359b:
          bVar17 = false;
        }
        else if (lVar10 < lVar5) goto LAB_0058359b;
        pVVar6 = pVVar6 + 1;
      }
      CVar16 = COVERAGE_FULL;
      if (!bVar17) {
        pixelCorners[0].m_data[0] = (long)pixel->m_data[0] << (bVar8 & 0x3f);
        pixelCorners[0].m_data[1] = (long)pixel->m_data[1] << (bVar8 & 0x3f);
        pixelCorners[1].m_data[0] = (long)(pixel->m_data[0] + 1) << (bVar8 & 0x3f);
        pixelCorners[2].m_data[1] = (long)(pixel->m_data[1] + 1) << (bVar8 & 0x3f);
        pixelCenterPosition.m_data[0] = pixelCorners[0].m_data[0] + uVar18;
        pixelCenterPosition.m_data[1] = pixelCorners[0].m_data[1] + uVar18;
        pixelCorners[1].m_data[1] = pixelCorners[0].m_data[1];
        pixelCorners[2].m_data[0] = pixelCorners[1].m_data[0];
        pixelCorners[3].m_data[0] = pixelCorners[0].m_data[0];
        pixelCorners[3].m_data[1] = pixelCorners[2].m_data[1];
        fVar25 = floorf(triangleScreenSpace[0].m_data[0] * fVar29);
        floorf(triangleScreenSpace[0].m_data[1] * fVar29);
        edge.m_data[0] = CONCAT44(-(uint)((int)fVar25 < 0),(int)fVar25);
        floorf(triangleScreenSpace[1].m_data[0] * fVar29);
        floorf(triangleScreenSpace[1].m_data[1] * fVar29);
        floorf(triangleScreenSpace[2].m_data[0] * fVar29);
        floorf(triangleScreenSpace[2].m_data[1] * fVar29);
        fVar25 = ceilf(triangleScreenSpace[0].m_data[0] * fVar29);
        ceilf(triangleScreenSpace[0].m_data[1] * fVar29);
        v.m_data[0] = CONCAT44(-(uint)((int)fVar25 < 0),(int)fVar25);
        ceilf(triangleScreenSpace[1].m_data[0] * fVar29);
        ceilf(triangleScreenSpace[1].m_data[1] * fVar29);
        ceilf(triangleScreenSpace[2].m_data[0] * fVar29);
        ceilf(triangleScreenSpace[2].m_data[1] * fVar29);
        pVVar6 = &pixelCenterPosition;
        if (multisample) {
          pVVar6 = pixelCorners;
        }
        uVar4 = 0;
        while (uVar15 = uVar4, uVar15 != 3) {
          uVar4 = uVar15 + 1;
          uVar19 = 0;
          uVar18 = 0;
          if (uVar4 != 3) {
            uVar18 = uVar4 & 0xffffffff;
          }
          for (; uVar19 != 4; uVar19 = uVar19 + 1) {
            pIVar1 = &edge;
            if ((uVar19 & 1) == 0) {
              pIVar1 = &v;
            }
            pIVar3 = &edge;
            if (uVar19 < 2) {
              pIVar3 = &v;
            }
            for (uVar20 = 0; uVar20 != 4; uVar20 = uVar20 + 1) {
              startPos.m_data[0] = pIVar1[uVar15].m_data[0];
              startPos.m_data[1] = pIVar3[uVar15].m_data[1];
              pIVar2 = &edge;
              if ((uVar20 & 1) == 0) {
                pIVar2 = &v;
              }
              endPos.m_data[0] = pIVar2[uVar18].m_data[0];
              pIVar2 = &edge;
              if (uVar20 < 2) {
                pIVar2 = &v;
              }
              endPos.m_data[1] = pIVar2[uVar18].m_data[1];
              a = pVVar6;
              for (lVar12 = 1; lVar12 != 5; lVar12 = lVar12 + 1) {
                a_00 = (Vector<long,_2> *)((long)pVVar6->m_data + (ulong)(((uint)lVar12 & 3) << 4));
                operator-(&endPos,&startPos);
                operator-(a,&startPos);
                operator-(a_00,&startPos);
                uVar11 = v0.m_data[1] * line.m_data[0] - v0.m_data[0] * line.m_data[1];
                uVar7 = line.m_data[0] * v1.m_data[1] - line.m_data[1] * v1.m_data[0];
                if ((-1 < (long)(uVar7 & uVar11)) && (((long)uVar11 < 1 || ((long)uVar7 < 1)))) {
                  operator-(a_00,a);
                  operator-(&startPos,a);
                  operator-(&endPos,a);
                  uVar11 = v0.m_data[1] * line.m_data[0] - v0.m_data[0] * line.m_data[1];
                  uVar7 = line.m_data[0] * v1.m_data[1] - line.m_data[1] * v1.m_data[0];
                  if ((-1 < (long)(uVar7 & uVar11)) && (((long)uVar11 < 1 || ((long)uVar7 < 1)))) {
                    if (uVar15 < 3) {
                      return COVERAGE_PARTIAL;
                    }
                    goto LAB_00583b06;
                  }
                }
                a = a + 1;
              }
            }
          }
        }
LAB_00583b06:
        lVar12 = -3;
        do {
          if (lVar12 == 0) {
            return COVERAGE_FULL;
          }
          lVar5 = lVar12 + 4;
          lVar12 = lVar12 + 1;
          if (lVar12 == 0) {
            lVar5 = 0;
          }
          operator-(&edge + lVar5,local_1d0);
          operator-(pVVar6,&edge + lVar5);
          local_1d0 = local_1d0 + 1;
        } while (-1 < v0.m_data[1] * line.m_data[0] - v0.m_data[0] * line.m_data[1]);
        CVar16 = COVERAGE_NONE;
      }
    }
  }
  return CVar16;
}

Assistant:

CoverageType calculateTriangleCoverage (const tcu::Vec4& p0, const tcu::Vec4& p1, const tcu::Vec4& p2, const tcu::IVec2& pixel, const tcu::IVec2& viewportSize, int subpixelBits, bool multisample)
{
	typedef tcu::Vector<deInt64, 2> I64Vec2;

	const deUint64		numSubPixels						= ((deUint64)1) << subpixelBits;
	const deUint64		pixelHitBoxSize						= (multisample) ? (numSubPixels) : (2+2);	//!< allow 4 central (2x2) for non-multisample pixels. Rounding may move edges 1 subpixel to any direction.
	const bool			order								= isTriangleClockwise(p0, p1, p2);			//!< clockwise / counter-clockwise
	const tcu::Vec4&	orderedP0							= p0;										//!< vertices of a clockwise triangle
	const tcu::Vec4&	orderedP1							= (order) ? (p1) : (p2);
	const tcu::Vec4&	orderedP2							= (order) ? (p2) : (p1);
	const tcu::Vec2		triangleNormalizedDeviceSpace[3]	=
	{
		tcu::Vec2(orderedP0.x() / orderedP0.w(), orderedP0.y() / orderedP0.w()),
		tcu::Vec2(orderedP1.x() / orderedP1.w(), orderedP1.y() / orderedP1.w()),
		tcu::Vec2(orderedP2.x() / orderedP2.w(), orderedP2.y() / orderedP2.w()),
	};
	const tcu::Vec2		triangleScreenSpace[3]				=
	{
		(triangleNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		(triangleNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		(triangleNormalizedDeviceSpace[2] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
	};

	// Broad bounding box - pixel check
	{
		const float minX = de::min(de::min(triangleScreenSpace[0].x(), triangleScreenSpace[1].x()), triangleScreenSpace[2].x());
		const float minY = de::min(de::min(triangleScreenSpace[0].y(), triangleScreenSpace[1].y()), triangleScreenSpace[2].y());
		const float maxX = de::max(de::max(triangleScreenSpace[0].x(), triangleScreenSpace[1].x()), triangleScreenSpace[2].x());
		const float maxY = de::max(de::max(triangleScreenSpace[0].y(), triangleScreenSpace[1].y()), triangleScreenSpace[2].y());

		if ((float)pixel.x() > maxX + 1 ||
			(float)pixel.y() > maxY + 1 ||
			(float)pixel.x() < minX - 1 ||
			(float)pixel.y() < minY - 1)
			return COVERAGE_NONE;
	}

	// Broad triangle - pixel area intersection
	{
		const I64Vec2 pixelCenterPosition = I64Vec2(pixel.x(), pixel.y()) * I64Vec2(numSubPixels, numSubPixels) + I64Vec2(numSubPixels / 2, numSubPixels / 2);
		const I64Vec2 triangleSubPixelSpaceRound[3] =
		{
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};

		// Check (using cross product) if pixel center is
		// a) too far from any edge
		// b) fully inside all edges
		bool insideAllEdges = true;
		for (int vtxNdx = 0; vtxNdx < 3; ++vtxNdx)
		{
			const int		otherVtxNdx				= (vtxNdx + 1) % 3;
			const deInt64	maxPixelDistanceSquared	= pixelHitBoxSize*pixelHitBoxSize; // Max distance from the pixel center from within the pixel is (sqrt(2) * boxWidth/2). Use 2x value for rounding tolerance
			const I64Vec2	edge					= triangleSubPixelSpaceRound[otherVtxNdx]	- triangleSubPixelSpaceRound[vtxNdx];
			const I64Vec2	v						= pixelCenterPosition						- triangleSubPixelSpaceRound[vtxNdx];
			const deInt64	crossProduct			= (edge.x() * v.y() - edge.y() * v.x());

			// distance from edge: (edge x v) / |edge|
			//     (edge x v) / |edge| > maxPixelDistance
			// ==> (edge x v)^2 / edge^2 > maxPixelDistance^2    | edge x v > 0
			// ==> (edge x v)^2 > maxPixelDistance^2 * edge^2
			if (crossProduct < 0 && crossProduct*crossProduct > maxPixelDistanceSquared * tcu::lengthSquared(edge))
				return COVERAGE_NONE;
			if (crossProduct < 0 || crossProduct*crossProduct < maxPixelDistanceSquared * tcu::lengthSquared(edge))
				insideAllEdges = false;
		}

		if (insideAllEdges)
			return COVERAGE_FULL;
	}

	// Accurate intersection for edge pixels
	{
		//  In multisampling, the sample points can be anywhere in the pixel, and in single sampling only in the center.
		const I64Vec2 pixelCorners[4] =
		{
			I64Vec2((pixel.x()+0) * numSubPixels, (pixel.y()+0) * numSubPixels),
			I64Vec2((pixel.x()+1) * numSubPixels, (pixel.y()+0) * numSubPixels),
			I64Vec2((pixel.x()+1) * numSubPixels, (pixel.y()+1) * numSubPixels),
			I64Vec2((pixel.x()+0) * numSubPixels, (pixel.y()+1) * numSubPixels),
		};
		const I64Vec2 pixelCenterCorners[4] =
		{
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 0, pixel.y() * numSubPixels + numSubPixels/2 + 0),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 1, pixel.y() * numSubPixels + numSubPixels/2 + 0),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 1, pixel.y() * numSubPixels + numSubPixels/2 + 1),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 0, pixel.y() * numSubPixels + numSubPixels/2 + 1),
		};

		// both rounding directions
		const I64Vec2 triangleSubPixelSpaceFloor[3] =
		{
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};
		const I64Vec2 triangleSubPixelSpaceCeil[3] =
		{
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};
		const I64Vec2* const corners = (multisample) ? (pixelCorners) : (pixelCenterCorners);

		// Test if any edge (with any rounding) intersects the pixel (boundary). If it does => Partial. If not => fully inside or outside

		for (int edgeNdx = 0; edgeNdx < 3; ++edgeNdx)
		for (int startRounding = 0; startRounding < 4; ++startRounding)
		for (int endRounding = 0; endRounding < 4; ++endRounding)
		{
			const int		nextEdgeNdx	= (edgeNdx+1) % 3;
			const I64Vec2	startPos	((startRounding&0x01)	? (triangleSubPixelSpaceFloor[edgeNdx].x())		: (triangleSubPixelSpaceCeil[edgeNdx].x()),		(startRounding&0x02)	? (triangleSubPixelSpaceFloor[edgeNdx].y())		: (triangleSubPixelSpaceCeil[edgeNdx].y()));
			const I64Vec2	endPos		((endRounding&0x01)		? (triangleSubPixelSpaceFloor[nextEdgeNdx].x())	: (triangleSubPixelSpaceCeil[nextEdgeNdx].x()),	(endRounding&0x02)		? (triangleSubPixelSpaceFloor[nextEdgeNdx].y())	: (triangleSubPixelSpaceCeil[nextEdgeNdx].y()));

			for (int pixelEdgeNdx = 0; pixelEdgeNdx < 4; ++pixelEdgeNdx)
			{
				const int pixelEdgeEnd = (pixelEdgeNdx + 1) % 4;

				if (lineLineIntersect(startPos, endPos, corners[pixelEdgeNdx], corners[pixelEdgeEnd]))
					return COVERAGE_PARTIAL;
			}
		}

		// fully inside or outside
		for (int edgeNdx = 0; edgeNdx < 3; ++edgeNdx)
		{
			const int		nextEdgeNdx		= (edgeNdx+1) % 3;
			const I64Vec2&	startPos		= triangleSubPixelSpaceFloor[edgeNdx];
			const I64Vec2&	endPos			= triangleSubPixelSpaceFloor[nextEdgeNdx];
			const I64Vec2	edge			= endPos - startPos;
			const I64Vec2	v				= corners[0] - endPos;
			const deInt64	crossProduct	= (edge.x() * v.y() - edge.y() * v.x());

			// a corner of the pixel is outside => "fully inside" option is impossible
			if (crossProduct < 0)
				return COVERAGE_NONE;
		}

		return COVERAGE_FULL;
	}
}